

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     DefaultPrintTo<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
               (long *param_1,ostream *param_2)

{
  long lVar1;
  long lVar2;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_33,1);
  lVar2 = *param_1;
  if (lVar2 != param_1[1]) {
    lVar1 = 0;
    do {
      if ((lVar1 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_35,1), lVar1 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_2," ...",4);
        goto LAB_00120f33;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_34,1);
      DefaultPrintTo<std::vector<int,std::allocator<int>>>(lVar2,param_2);
      lVar2 = lVar2 + 0x18;
      lVar1 = lVar1 + 1;
    } while (lVar2 != param_1[1]);
    if (lVar1 != 0) {
LAB_00120f33:
      std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_31,1);
  return;
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}